

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UniformBufferStorageTestCase::initTestCaseGlobal(UniformBufferStorageTestCase *this)

{
  uint uVar1;
  GLenum GVar2;
  GLuint GVar3;
  ostream *poVar4;
  TestError *this_00;
  uchar *puVar5;
  uint local_23c;
  uint *puStack_238;
  uint n_vertex;
  uint *ubo_data_traveller_ptr;
  uint tfbo_size;
  uint n_vs_body_parts;
  char *vs_body_parts [3];
  string local_208 [48];
  char *local_1d8;
  char *vs_body_main;
  char *vs_body_preamble;
  char *tf_varying;
  string vs_body_define_string;
  stringstream vs_body_define_sstream;
  ostream local_190;
  GLint local_14;
  UniformBufferStorageTestCase *pUStack_10;
  GLint gl_max_uniform_block_size_value;
  UniformBufferStorageTestCase *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  (*this->m_gl->getIntegerv)(0x8a30,&local_14);
  (*this->m_gl->getIntegerv)(0x8a34,&this->m_gl_uniform_buffer_offset_alignment_value);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGetIntegerv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1913);
  this->m_n_ubo_uints = (uint)((ulong)(long)local_14 >> 2);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(vs_body_define_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tf_varying);
  vs_body_preamble = "result";
  vs_body_main = "#version 140\n\n";
  local_1d8 = 
  "\nuniform data\n{\n    uint data_input[N_UBO_UINTS];};\n\nout uint result;\n\nvoid main()\n{\n    result = (data_input[gl_VertexID] == uint(gl_VertexID) ) ? 1u : 0u;\n}"
  ;
  poVar4 = std::operator<<(&local_190,"#define N_UBO_UINTS (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_n_ubo_uints);
  std::operator<<(poVar4,")\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&tf_varying,local_208);
  std::__cxx11::string::~string(local_208);
  _tfbo_size = vs_body_main;
  vs_body_parts[0] = (char *)std::__cxx11::string::c_str();
  vs_body_parts[1] = local_1d8;
  GVar3 = SparseBufferTestUtilities::createProgram
                    (this->m_gl,(char **)0x0,0,(char **)&tfbo_size,3,(char **)0x0,(uint *)0x0,0,
                     &vs_body_preamble,1,0x8c8c);
  this->m_po = GVar3;
  if (this->m_po == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"The test program failed to link",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
               ,0x193f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  this->m_sparse_bo_data_size = this->m_page_size << 2;
  this->m_sparse_bo_size = this->m_page_size * this->m_gl_uniform_buffer_offset_alignment_value * 2;
  if (this->m_sparse_bo_size < this->m_sparse_bo_data_size << 1) {
    this->m_sparse_bo_size = this->m_sparse_bo_data_size << 1;
  }
  this->m_sparse_bo_size_rounded = this->m_sparse_bo_size;
  this->m_sparse_bo_data_start_offset = this->m_sparse_bo_size - this->m_sparse_bo_data_size >> 1;
  uVar1 = this->m_n_ubo_uints;
  (*this->m_gl->genBuffers)(1,&this->m_tf_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x195a);
  (*this->m_gl->bindBuffer)(0x8c8e,this->m_tf_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x195d);
  (*this->m_gl->bufferStorage)(0x8c8e,(ulong)(uVar1 << 2),(void *)0x0,1);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1961);
  (*this->m_gl->bindBufferBase)(0x8c8e,0,this->m_tf_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1965);
  puVar5 = (uchar *)operator_new__((ulong)this->m_sparse_bo_data_size,(nothrow_t *)&std::nothrow);
  this->m_ubo_data = puVar5;
  puStack_238 = (uint *)this->m_ubo_data;
  for (local_23c = 0; local_23c < this->m_sparse_bo_data_size >> 2; local_23c = local_23c + 1) {
    *puStack_238 = local_23c;
    puStack_238 = puStack_238 + 1;
  }
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1979);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x197c);
  (*this->m_gl->bufferStorage)(0x8f36,(ulong)this->m_sparse_bo_data_size,this->m_ubo_data,0);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1980);
  (*this->m_gl->genVertexArrays)(1,&this->m_vao);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1984);
  (*this->m_gl->bindVertexArray)(this->m_vao);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1987);
  std::__cxx11::string::~string((string *)&tf_varying);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(vs_body_define_string.field_2._M_local_buf + 8));
  return true;
}

Assistant:

bool UniformBufferStorageTestCase::initTestCaseGlobal()
{
	/* Cache GL constant values */
	glw::GLint gl_max_uniform_block_size_value = 0;

	m_gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &gl_max_uniform_block_size_value);
	m_gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &m_gl_uniform_buffer_offset_alignment_value);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetIntegerv() call(s) failed.");

	/* Determine the number of uints we can access at once from a single VS invocation */
	DE_ASSERT(gl_max_uniform_block_size_value >= 1);

	m_n_ubo_uints = static_cast<unsigned int>(gl_max_uniform_block_size_value / sizeof(unsigned int));

	/* Prepare the test program */
	std::stringstream vs_body_define_sstream;
	std::string		  vs_body_define_string;

	const char* tf_varying		 = "result";
	const char* vs_body_preamble = "#version 140\n"
								   "\n";

	const char* vs_body_main = "\n"
							   "uniform data\n"
							   "{\n"
							   "    uint data_input[N_UBO_UINTS];"
							   "};\n"
							   "\n"
							   "out uint result;\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    result = (data_input[gl_VertexID] == uint(gl_VertexID) ) ? 1u : 0u;\n"
							   "}";

	vs_body_define_sstream << "#define N_UBO_UINTS (" << m_n_ubo_uints << ")\n";
	vs_body_define_string = vs_body_define_sstream.str();

	const char*		   vs_body_parts[] = { vs_body_preamble, vs_body_define_string.c_str(), vs_body_main };
	const unsigned int n_vs_body_parts = sizeof(vs_body_parts) / sizeof(vs_body_parts[0]);

	m_po = SparseBufferTestUtilities::createProgram(m_gl, DE_NULL,							 /* fs_body_parts */
													0,										 /* n_fs_body_parts */
													vs_body_parts, n_vs_body_parts, DE_NULL, /* attribute_names */
													DE_NULL,								 /* attribute_locations */
													0,				/* n_attribute_properties */
													&tf_varying, 1, /* n_tf_varyings */
													GL_INTERLEAVED_ATTRIBS);

	if (m_po == 0)
	{
		TCU_FAIL("The test program failed to link");
	}

	/* Determine the number of bytes the sparse buffer needs to be able to have
	 * a physical backing or.
	 *
	 * We will provide physical backing for twice the required size and then use
	 * a region in the centered of the allocated memory block.
	 *
	 * NOTE: We need to be able to use an offset which is aligned to both the page size,
	 *       and the UB offset alignment.
	 * */
	m_sparse_bo_data_size = static_cast<unsigned int>(sizeof(unsigned int) * m_page_size);
	m_sparse_bo_size	  = (m_page_size * m_gl_uniform_buffer_offset_alignment_value) * 2;

	if (m_sparse_bo_size < m_sparse_bo_data_size * 2)
	{
		m_sparse_bo_size = m_sparse_bo_data_size * 2;
	}

	m_sparse_bo_size_rounded	  = m_sparse_bo_size; /* rounded to the page size by default */
	m_sparse_bo_data_start_offset = (m_sparse_bo_size - m_sparse_bo_data_size) / 2;

	/* Set up the TFBO storage */
	const unsigned tfbo_size = static_cast<unsigned int>(sizeof(unsigned int) * m_n_ubo_uints);

	m_gl.genBuffers(1, &m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_TRANSFORM_FEEDBACK_BUFFER, tfbo_size, DE_NULL, /* data */
					   GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	m_gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
						m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Set up the UBO contents. We're actually setting up an immutable BO here,
	 * but we'll use its contents for a copy op, executed at the beginning of
	 * each iteration.
	 */
	unsigned int* ubo_data_traveller_ptr = DE_NULL;

	DE_ASSERT((m_sparse_bo_data_size % sizeof(unsigned int)) == 0);

	m_ubo_data			   = new (std::nothrow) unsigned char[m_sparse_bo_data_size];
	ubo_data_traveller_ptr = (unsigned int*)m_ubo_data;

	for (unsigned int n_vertex = 0; n_vertex < m_sparse_bo_data_size / sizeof(unsigned int); ++n_vertex)
	{
		*ubo_data_traveller_ptr = n_vertex;
		ubo_data_traveller_ptr++;
	}

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	/* Set up helper BO storage */
	m_gl.bufferStorage(GL_COPY_READ_BUFFER, m_sparse_bo_data_size, m_ubo_data, 0); /* flags */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	/* Set up the VAO */
	m_gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenVertexArrays() call failed.");

	m_gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindVertexArray() call failed.");

	return true;
}